

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceVkImpl::RenderDeviceVkImpl
          (RenderDeviceVkImpl *this,IReferenceCounters *pRefCounters,
          IMemoryAllocator *RawMemAllocator,IEngineFactory *pEngineFactory,
          EngineVkCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo,size_t CommandQueueCount,
          ICommandQueueVk **CmdQueues,shared_ptr<VulkanUtilities::VulkanInstance> Instance,
          unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          PhysicalDevice,shared_ptr<VulkanUtilities::VulkanLogicalDevice> LogicalDevice)

{
  unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EngineVkCreateInfo *pEVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  VulkanPhysicalDevice *pVVar7;
  element_type *peVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  pointer pvVar11;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *pRVar12;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *pRVar13;
  SoftwareQueueIndex SVar14;
  pointer __p;
  IMemoryAllocator *pIVar15;
  pointer __p_00;
  RenderPassCache *this_01;
  ICommandQueueVk *pIVar16;
  __node_base_ptr p_Var17;
  VkDescriptorPoolSize this_02;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  __node_base_ptr p_Var21;
  VkDescriptorType VVar22;
  pointer __p_1;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  HardwareQueueIndex QueueFamilyIndex;
  VkDescriptorType local_15c;
  EngineVkCreateInfo *local_158;
  vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
  *local_150;
  unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_> *local_148;
  unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_> *local_140;
  _Hashtable<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>,std::__detail::_Select1st,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_138;
  char *local_130;
  size_type local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  undefined1 local_110 [12];
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  DEVICE_FEATURE_STATE DStack_f1;
  undefined4 local_f0;
  undefined3 local_ec;
  DEVICE_FEATURE_STATE DStack_e9;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_> *local_b0
  ;
  VulkanDynamicMemoryManager *local_a8;
  string local_a0;
  string local_80;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_60;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_48;
  
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::RenderDeviceNextGenBase
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ,pRefCounters,RawMemAllocator,pEngineFactory,CommandQueueCount,CmdQueues,
             (EngineCreateInfo *)EngineCI,AdapterInfo);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.super_ObjectBase<Diligent::IRenderDeviceVk>
  .super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject = (IObject)&PTR_QueryInterface_00aff458;
  (this->m_Properties).UploadHeapPageSize = *(Uint32 *)(EngineCI + 0x130);
  (this->m_Properties).DynamicHeapPageSize = *(Uint32 *)(EngineCI + 0x138);
  (this->m_VulkanInstance).
  super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((Instance.super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
       super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = ((Instance.
             super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
           super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->m_VulkanInstance).
  super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var6;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  (this->m_PhysicalDevice)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl =
       (VulkanPhysicalDevice *)
       (Instance.super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_vptr__Sp_counted_base;
  (Instance.super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        PhysicalDevice._M_t.
        super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        ._M_t.
        super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)PhysicalDevice._M_t.
                   super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                   .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                   _M_head_impl + 8);
  *(undefined8 *)
   ((long)PhysicalDevice._M_t.
          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          ._M_t.
          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl + 8) =
       0;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  *(undefined8 *)
   PhysicalDevice._M_t.
   super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
   ._M_t.
   super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
   .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl = 0;
  this_00 = &this->m_FramebufferCache;
  local_140 = &this->m_ImplicitRenderPassCache;
  (this->m_FramebufferCache)._M_t.
  super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
  .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl = (FramebufferCache *)0x0
  ;
  (this->m_ImplicitRenderPassCache)._M_t.
  super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>.
  _M_t.
  super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
  .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl = (RenderPassCache *)0x0;
  local_158 = EngineCI;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Main descriptor pool","");
  pEVar2 = local_158;
  local_110._0_8_ = (ulong)*(uint *)(local_158 + 0xcc) << 0x20;
  uStack_104 = *(undefined4 *)(local_158 + 0xd0);
  local_110._8_4_ = 1;
  local_100._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL;
  local_100._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_100._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_100._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_fc = *(undefined4 *)(local_158 + 0xd4);
  uStack_f8._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL|DEVICE_FEATURE_STATE_ENABLED;
  uStack_f8._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f8._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f8._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f4 = *(undefined4 *)(local_158 + 0xd8);
  local_f0._0_1_ = 4;
  local_f0._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_f0._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_f0._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  _local_ec = *(undefined4 *)(local_158 + 0xe4);
  local_e8._0_1_ = 5;
  local_e8._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e8._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e8._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e4 = *(undefined4 *)(local_158 + 0xe8);
  local_e0 = 6;
  local_dc = *(undefined4 *)(local_158 + 0xdc);
  local_d8 = 7;
  local_d4 = *(undefined4 *)(local_158 + 0xe0);
  local_d0 = 8;
  local_c8 = 9;
  local_c0 = 10;
  local_bc = *(undefined4 *)(local_158 + 0xec);
  local_b8 = 0x3b9d13f0;
  local_b4 = *(undefined4 *)(local_158 + 0xf0);
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_110;
  local_cc = local_dc;
  local_c4 = local_d4;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (&local_48,__l,(allocator_type *)&local_15c);
  DescriptorSetAllocator::DescriptorSetAllocator
            (&this->m_DescriptorSetAllocator,this,&local_80,&local_48,*(uint32_t *)(pEVar2 + 200),
             true);
  if (local_48.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Dynamic descriptor pool","");
  pEVar2 = local_158;
  local_110._0_8_ = (ulong)*(uint *)(local_158 + 0xf8) << 0x20;
  stack0xfffffffffffffef8 = (undefined4 *)CONCAT44(*(undefined4 *)(local_158 + 0xfc),1);
  local_100._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL;
  local_100._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_100._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_100._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_fc = *(undefined4 *)(local_158 + 0x100);
  uStack_f8._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL|DEVICE_FEATURE_STATE_ENABLED;
  uStack_f8._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f8._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f8._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_f4 = *(undefined4 *)(local_158 + 0x104);
  local_f0._0_1_ = 4;
  local_f0._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_f0._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_f0._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  _local_ec = *(undefined4 *)(local_158 + 0x110);
  local_e8._0_1_ = 5;
  local_e8._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e8._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e8._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_e4 = *(undefined4 *)(local_158 + 0x114);
  local_e0 = 6;
  local_dc = *(undefined4 *)(local_158 + 0x108);
  local_d8 = 7;
  local_d4 = *(undefined4 *)(local_158 + 0x10c);
  local_d0 = 8;
  local_c8 = 9;
  local_c0 = 10;
  local_bc = *(undefined4 *)(local_158 + 0xec);
  local_b8 = 0x3b9d13f0;
  local_b4 = *(undefined4 *)(local_158 + 0xf0);
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)local_110;
  local_cc = local_dc;
  local_c4 = local_d4;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (&local_60,__l_00,(allocator_type *)&local_15c);
  DescriptorPoolManager::DescriptorPoolManager
            (&this->m_DynamicDescriptorPool,this,&local_a0,&local_60,*(uint32_t *)(pEVar2 + 0xf4),
             false);
  if (local_60.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_138 = (_Hashtable<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>,std::__detail::_Select1st,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->m_TransientCmdPoolMgrs;
  (this->m_TransientCmdPoolMgrs)._M_h._M_buckets =
       &(this->m_TransientCmdPoolMgrs)._M_h._M_single_bucket;
  (this->m_TransientCmdPoolMgrs)._M_h._M_bucket_count = 1;
  (this->m_TransientCmdPoolMgrs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_element_count = 0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_150 = (vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
               *)&this->m_QueryMgrs;
  (this->m_TransientCmdPoolMgrs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = &local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Global resource memory manager","");
  pVVar7 = (this->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  peVar8 = (this->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pIVar15 = GetRawAllocator();
  uVar19 = *(uint *)(local_158 + 0x120);
  uVar3 = *(uint *)(local_158 + 0x124);
  uVar4 = *(uint *)(local_158 + 0x128);
  uVar5 = *(uint *)(local_158 + 300);
  (this->m_MemoryMgr)._vptr_VulkanMemoryManager = (_func_int **)&PTR_OnNewPageCreated_00aff6a8;
  paVar1 = &(this->m_MemoryMgr).m_MgrName.field_2;
  (this->m_MemoryMgr).m_MgrName._M_dataplus._M_p = (pointer)paVar1;
  if (local_130 == &local_120) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_11f,local_120);
    *(undefined8 *)((long)&(this->m_MemoryMgr).m_MgrName.field_2 + 8) = uStack_118;
  }
  else {
    (this->m_MemoryMgr).m_MgrName._M_dataplus._M_p = local_130;
    (this->m_MemoryMgr).m_MgrName.field_2._M_allocated_capacity = CONCAT71(uStack_11f,local_120);
  }
  (this->m_MemoryMgr).m_MgrName._M_string_length = local_128;
  local_128 = 0;
  local_120 = '\0';
  (this->m_MemoryMgr).m_LogicalDevice = peVar8;
  (this->m_MemoryMgr).m_PhysicalDevice = pVVar7;
  (this->m_MemoryMgr).m_Allocator = pIVar15;
  (this->m_MemoryMgr).m_PagesMtx.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_MemoryMgr).m_PagesMtx.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_MemoryMgr).m_PagesMtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_MemoryMgr).m_PagesMtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_MemoryMgr).m_PagesMtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_MemoryMgr).m_Pages._M_h._M_buckets = &(this->m_MemoryMgr).m_Pages._M_h._M_single_bucket;
  (this->m_MemoryMgr).m_Pages._M_h._M_bucket_count = 1;
  (this->m_MemoryMgr).m_Pages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_MemoryMgr).m_Pages._M_h._M_element_count = 0;
  (this->m_MemoryMgr).m_Pages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_MemoryMgr).m_Pages._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_MemoryMgr).m_Pages._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_MemoryMgr).m_DeviceLocalPageSize = (ulong)uVar19;
  (this->m_MemoryMgr).m_HostVisiblePageSize = (ulong)uVar3;
  (this->m_MemoryMgr).m_DeviceLocalReserveSize = (ulong)uVar4;
  (this->m_MemoryMgr).m_HostVisibleReserveSize = (ulong)uVar5;
  (this->m_MemoryMgr).m_CurrUsedSize._M_elems[0].super___atomic_base<long>._M_i = 0;
  (this->m_MemoryMgr).m_CurrUsedSize._M_elems[1].super___atomic_base<long>._M_i = 0;
  (this->m_MemoryMgr).m_PeakUsedSize._M_elems[0] = 0;
  (this->m_MemoryMgr).m_PeakUsedSize._M_elems[1] = 0;
  (this->m_MemoryMgr).m_CurrAllocatedSize._M_elems[0] = 0;
  (this->m_MemoryMgr).m_CurrAllocatedSize._M_elems[1] = 0;
  (this->m_MemoryMgr).m_PeakAllocatedSize._M_elems[0] = 0;
  (this->m_MemoryMgr).m_PeakAllocatedSize._M_elems[1] = 0;
  local_130 = &local_120;
  pIVar15 = GetRawAllocator();
  pEVar2 = local_158;
  local_a8 = &this->m_DynamicMemoryManager;
  VulkanDynamicMemoryManager::VulkanDynamicMemoryManager
            (local_a8,pIVar15,this,*(Uint32 *)(local_158 + 0x134),0xffffffffffffffff);
  local_148 = &this->m_pDxCompiler;
  CreateDXCompiler((Diligent *)local_148,Vulkan,
                   ((this->m_PhysicalDevice)._M_t.
                    super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                    .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                   _M_head_impl)->m_VkVersion,*(char **)(pEVar2 + 0x158));
  local_b0 = this_00;
  if ((((this->m_LogicalVkDevice).
        super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->m_EnabledExtFeatures).DynamicRendering.dynamicRendering == 0) {
    __p_00 = (pointer)operator_new(0xd8);
    __p_00->m_DeviceVk = this;
    (__p_00->m_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(__p_00->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(__p_00->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (__p_00->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (__p_00->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    (__p_00->m_Cache)._M_h._M_buckets = &(__p_00->m_Cache)._M_h._M_single_bucket;
    (__p_00->m_Cache)._M_h._M_bucket_count = 1;
    (__p_00->m_Cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p_00->m_Cache)._M_h._M_element_count = 0;
    (__p_00->m_Cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p_00->m_Cache)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p_00->m_Cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__p_00->m_ViewToKeyMap)._M_h._M_buckets = &(__p_00->m_ViewToKeyMap)._M_h._M_single_bucket;
    (__p_00->m_ViewToKeyMap)._M_h._M_bucket_count = 1;
    (__p_00->m_ViewToKeyMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p_00->m_ViewToKeyMap)._M_h._M_element_count = 0;
    (__p_00->m_ViewToKeyMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p_00->m_ViewToKeyMap)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p_00->m_ViewToKeyMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_buckets =
         &(__p_00->m_RenderPassToKeyMap)._M_h._M_single_bucket;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_bucket_count = 1;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_element_count = 0;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p_00->m_RenderPassToKeyMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_110._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_110._4_4_ = 0;
    std::
    __uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    reset((__uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
           *)this_00,__p_00);
    std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    ~unique_ptr((unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
                 *)local_110);
    this_01 = (RenderPassCache *)operator_new(0x68);
    RenderPassCache::RenderPassCache(this_01,this);
    local_110._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_110._4_4_ = 0;
    std::__uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
    ::reset((__uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
             *)local_140,this_01);
    std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
    ~unique_ptr((unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
                 *)local_110);
  }
  pVVar7 = (this->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  uVar19 = pVVar7->m_VkVersion;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type =
       RENDER_DEVICE_TYPE_VULKAN;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.APIVersion =
       (Version)(CONCAT44(uVar19 >> 0xc,uVar19 >> 0x16) & 0x3ff0000007f);
  peVar8 = (this->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  VkFeaturesToDeviceFeatures
            ((DeviceFeatures *)local_110,uVar19,&peVar8->m_EnabledFeatures,&pVVar7->m_Properties,
             &peVar8->m_EnabledExtFeatures,&pVVar7->m_ExtProperties,DEVICE_FEATURE_STATE_ENABLED);
  pRVar12 = &this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = DStack_f1;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceStaticArrays = (char)local_f0;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceRuntimeArrays = SUB41(local_f0,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.WaveOp =
       SUB41(local_f0,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  InstanceDataStepRate = SUB41(local_f0,3);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.NativeFence
       = (char)local_ec;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.TileShaders
       = SUB31(local_ec,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TransferQueueTimestampQueries = SUB31(local_ec,2);
  pRVar12 = &this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VariableRateShading = DStack_e9;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SparseResources = (char)local_e8;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SubpassFramebufferFetch = SUB41(local_e8,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureComponentSwizzle = SUB41(local_e8,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureSubresourceViews = SUB41(local_e8,3);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  NativeMultiDraw = (char)(undefined3)local_e4;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  AsyncShaderCompilation = SUB31((undefined3)local_e4,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  FormattedBuffers = SUB31((undefined3)local_e4,2);
  pRVar12 = &this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.DepthClamp =
       (char)local_100;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  IndependentBlend = SUB41(local_100,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DualSourceBlend = SUB41(local_100,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  MultiViewport = SUB41(local_100,3);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionBC = (char)uStack_fc;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionETC2 = SUB41(uStack_fc,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VertexPipelineUAVWritesAndAtomics = SUB41(uStack_fc,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  PixelUAVWritesAndAtomics = SUB41(uStack_fc,3);
  pRVar12 = &this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureUAVExtendedFormats = (char)uStack_f8;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderFloat16 = SUB41(uStack_f8,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer16BitAccess = SUB41(uStack_f8,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer16BitAccess = SUB41(uStack_f8,3);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderInputOutput16 = (char)uStack_f4;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.ShaderInt8 =
       SUB41(uStack_f4,1);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer8BitAccess = SUB41(uStack_f4,2);
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = SUB41(uStack_f4,3);
  pRVar12 = &this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SeparablePrograms = local_110[0];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceQueries = local_110[1];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  WireframeFill = local_110[2];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  MultithreadedResourceCreation = local_110[3];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ComputeShaders = local_110[4];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  GeometryShaders = local_110[5];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.Tessellation
       = local_110[6];
  (pRVar12->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.MeshShaders
       = local_110[7];
  *(undefined4 **)
   &(this->
    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing =
       stack0xfffffffffffffef8;
  pRVar13 = &(this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.HLSL.Major = 5;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.HLSL.Minor = 1;
  pRVar13 = &(this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.GLSL.Major = 4;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.GLSL.Minor = 6;
  pRVar13 = &(this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.GLESSL.Major = 3;
  (pRVar13->m_DeviceInfo).MaxShaderVersion.GLESSL.Minor = 2;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.MinZ = 0.0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.ZtoDepthScale = 1.0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.YtoVScale = -0.5;
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::reserve((vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
             *)local_150,CommandQueueCount);
  if (CommandQueueCount != 0) {
    pEVar2 = local_158 + 0x13c;
    uVar18 = 0;
    do {
      VVar22 = (VkDescriptorType)uVar18;
      local_110._0_4_ = VVar22;
      SVar14.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)local_110);
      pIVar16 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ::GetCommandQueue(&this->
                                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                  ,SVar14);
      local_110._0_4_ = (*(pIVar16->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar16);
      QueueFamilyIndex.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)local_110);
      uVar18 = (this->m_TransientCmdPoolMgrs)._M_h._M_bucket_count;
      uVar20 = (ulong)QueueFamilyIndex.m_Value % uVar18;
      p_Var9 = (this->m_TransientCmdPoolMgrs)._M_h._M_buckets[uVar20 & 0xffffffff];
      p_Var17 = (__node_base_ptr)0x0;
      if ((p_Var9 != (__node_base_ptr)0x0) &&
         (p_Var17 = p_Var9, p_Var21 = p_Var9->_M_nxt,
         QueueFamilyIndex.m_Value != *(byte *)&p_Var9->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var21->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var17 = (__node_base_ptr)0x0;
          if (((ulong)*(byte *)&p_Var10[1]._M_nxt % uVar18 != uVar20) ||
             (p_Var17 = p_Var21, p_Var21 = p_Var10,
             QueueFamilyIndex.m_Value == *(byte *)&p_Var10[1]._M_nxt)) goto LAB_0021221e;
        }
        p_Var17 = (__node_base_ptr)0x0;
      }
LAB_0021221e:
      if ((p_Var17 == (__node_base_ptr)0x0) || (p_Var17->_M_nxt == (_Hash_node_base *)0x0)) {
        local_110._0_8_ =
             (this->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        unique0x00005300 = &uStack_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_110 + 8),"Transient command buffer pool manager","");
        local_e8._0_1_ = QueueFamilyIndex.m_Value;
        local_e4 = 1;
        std::
        _Hashtable<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>,std::__detail::_Select1st,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const&,Diligent::CommandPoolManager::CreateInfo>
                  (local_138,&QueueFamilyIndex,
                   (unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                    *)local_110);
        if (stack0xfffffffffffffef8 != &uStack_f8) {
          operator_delete(stack0xfffffffffffffef8,CONCAT44(uStack_f4,uStack_f8) + 1);
        }
      }
      local_15c = VVar22;
      SVar14.m_Value = StaticCast<unsigned_char,unsigned_int>(&local_15c);
      this_02 = (VkDescriptorPoolSize)operator_new(0x310);
      QueryManagerVk::QueryManagerVk((QueryManagerVk *)this_02,this,(Uint32 *)pEVar2,SVar14);
      local_110._0_8_ = this_02;
      std::
      vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
      ::
      emplace_back<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>
                (local_150,
                 (unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                  *)local_110);
      std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>::
      ~unique_ptr((unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                   *)local_110);
      uVar18 = (ulong)(VVar22 + VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);
    } while (uVar18 < CommandQueueCount);
  }
  pvVar11 = (this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = ((long)(this->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo.
                  super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
           -0x3333333333333333;
  if (1 < uVar18) {
    uVar20 = 1;
    uVar19 = 2;
    do {
      pvVar11[uVar20].super_TextureFormatInfo.Supported = true;
      uVar20 = (ulong)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar20 <= uVar18 && uVar18 - uVar20 != 0);
  }
  RenderDeviceBase<Diligent::EngineVkImplTraits>::InitShaderCompilationThreadPool
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,
             *(IThreadPool **)(local_158 + 0x60),*(Uint32 *)(local_158 + 0x68));
  return;
}

Assistant:

RenderDeviceVkImpl::RenderDeviceVkImpl(IReferenceCounters*                                    pRefCounters,
                                       IMemoryAllocator&                                      RawMemAllocator,
                                       IEngineFactory*                                        pEngineFactory,
                                       const EngineVkCreateInfo&                              EngineCI,
                                       const GraphicsAdapterInfo&                             AdapterInfo,
                                       size_t                                                 CommandQueueCount,
                                       ICommandQueueVk**                                      CmdQueues,
                                       std::shared_ptr<VulkanUtilities::VulkanInstance>       Instance,
                                       std::unique_ptr<VulkanUtilities::VulkanPhysicalDevice> PhysicalDevice,
                                       std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>  LogicalDevice) :
    // clang-format off
    TRenderDeviceBase
    {
        pRefCounters,
        RawMemAllocator,
        pEngineFactory,
        CommandQueueCount,
        CmdQueues,
        EngineCI,
        AdapterInfo
    },
    m_Properties
    {
        EngineCI.UploadHeapPageSize,
        EngineCI.DynamicHeapPageSize
    },
    m_VulkanInstance         {Instance                 },
    m_PhysicalDevice         {std::move(PhysicalDevice)},
    m_LogicalVkDevice        {std::move(LogicalDevice) },
    m_DescriptorSetAllocator
    {
        *this,
        "Main descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.MainDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.MainDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.MainDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.MainDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.MainDescriptorPoolSize.MaxDescriptorSets,
        true
    },
    m_DynamicDescriptorPool
    {
        *this,
        "Dynamic descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.DynamicDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.DynamicDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.DynamicDescriptorPoolSize.MaxDescriptorSets,
        false // Pools can only be reset
    },
    m_MemoryMgr
    {
        "Global resource memory manager",
        *m_LogicalVkDevice,
        *m_PhysicalDevice,
        GetRawAllocator(),
        EngineCI.DeviceLocalMemoryPageSize,
        EngineCI.HostVisibleMemoryPageSize,
        EngineCI.DeviceLocalMemoryReserveSize,
        EngineCI.HostVisibleMemoryReserveSize
    },
    m_DynamicMemoryManager
    {
        GetRawAllocator(),
        *this,
        EngineCI.DynamicHeapSize,
        ~Uint64{0}
    },
    m_pDxCompiler{CreateDXCompiler(DXCompilerTarget::Vulkan, m_PhysicalDevice->GetVkVersion(), EngineCI.pDxCompilerPath)}
// clang-format on
{
    if (!m_LogicalVkDevice->GetEnabledExtFeatures().DynamicRendering.dynamicRendering)
    {
        m_FramebufferCache        = std::make_unique<FramebufferCache>(*this);
        m_ImplicitRenderPassCache = std::make_unique<RenderPassCache>(*this);
    }

    static_assert(sizeof(VulkanDescriptorPoolSize) == sizeof(Uint32) * 11, "Please add new descriptors to m_DescriptorSetAllocator and m_DynamicDescriptorPool constructors");

    const uint32_t vkVersion = m_PhysicalDevice->GetVkVersion();
    m_DeviceInfo.Type        = RENDER_DEVICE_TYPE_VULKAN;
    m_DeviceInfo.APIVersion  = Version{VK_API_VERSION_MAJOR(vkVersion), VK_API_VERSION_MINOR(vkVersion)};

    m_DeviceInfo.Features = VkFeaturesToDeviceFeatures(vkVersion,
                                                       m_LogicalVkDevice->GetEnabledFeatures(),
                                                       m_PhysicalDevice->GetProperties(),
                                                       m_LogicalVkDevice->GetEnabledExtFeatures(),
                                                       m_PhysicalDevice->GetExtProperties());

    m_DeviceInfo.MaxShaderVersion.HLSL   = {5, 1};
    m_DeviceInfo.MaxShaderVersion.GLSL   = {4, 6};
    m_DeviceInfo.MaxShaderVersion.GLESSL = {3, 2};

    // Note that Vulkan itself does not invert Y coordinate when transforming
    // normalized device Y to window space. However, we use negative viewport
    // height which achieves the same effect as in D3D, therefore we need to
    // invert y (see comments in DeviceContextVkImpl::CommitViewports() for details)
    m_DeviceInfo.NDC = NDCAttribs{0.0f, 1.0f, -0.5f};

    // Every queue family needs its own command pool.
    // Every queue needs its own query pool.
    m_QueryMgrs.reserve(CommandQueueCount);
    for (Uint32 q = 0; q < CommandQueueCount; ++q)
    {
        const HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(SoftwareQueueIndex{q}).GetQueueFamilyIndex()};

        if (m_TransientCmdPoolMgrs.find(QueueFamilyIndex) == m_TransientCmdPoolMgrs.end())
        {
            m_TransientCmdPoolMgrs.emplace(
                QueueFamilyIndex,
                CommandPoolManager::CreateInfo{
                    //
                    GetLogicalDevice(),
                    "Transient command buffer pool manager",
                    QueueFamilyIndex,
                    VK_COMMAND_POOL_CREATE_TRANSIENT_BIT //
                });
        }

        m_QueryMgrs.emplace_back(std::make_unique<QueryManagerVk>(this, EngineCI.QueryPoolSizes, SoftwareQueueIndex{q}));
    }

    for (Uint32 fmt = 1; fmt < m_TextureFormatsInfo.size(); ++fmt)
        m_TextureFormatsInfo[fmt].Supported = true; // We will test every format on a specific hardware device

    InitShaderCompilationThreadPool(EngineCI.pAsyncShaderCompilationThreadPool, EngineCI.NumAsyncShaderCompilationThreads);
}